

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::GenerateClearBit_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int bitIndex)

{
  undefined1 local_d8 [8];
  string mask;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string varName;
  
  GetBitFieldNameForBit_abi_cxx11_((string *)local_58,this,bitIndex);
  std::__cxx11::string::string
            ((string *)local_d8,
             *(char **)(bit_masks +
                       (long)(int)((long)((ulong)(uint)((int)this >> 0x1f) << 0x20 |
                                         (ulong)this & 0xffffffff) % 0x20) * 8),
             (allocator *)(varName.field_2._M_local_buf + 8));
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 " = (");
  std::operator+(&local_98,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mask.field_2 + 8),&local_98," & ~");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&varName.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mask.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&varName.field_2 + 8),")");
  std::__cxx11::string::~string((string *)(varName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(mask.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateClearBit(int bitIndex) {
  std::string varName = GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = varName + " = (" + varName + " & ~" + mask + ")";
  return result;
}